

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Generators<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
* __thiscall
Catch::Generators::
makeGenerators<binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>>
          (Generators<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
           *__return_storage_ptr__,Generators *this,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *val,binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
               *moreGenerators,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_1,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_2,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_3,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_4,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_5,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_6,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_7,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_8)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
  local_38;
  
  local_38.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
  .
  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
        )operator_new(0x38);
  *(undefined ***)
   local_38.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
   .
   super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
   ._M_head_impl = &PTR__GeneratorUntypedBase_003194e8;
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(this + 0x10);
  lVar3 = *(long *)(this + 0x18);
  lVar4 = *(long *)(this + 0x20);
  lVar5 = *(long *)(this + 0x28);
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
                  ._M_head_impl + 8) = *(long *)this;
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
                  ._M_head_impl + 0x10) = lVar1;
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
                  ._M_head_impl + 0x18) = lVar2;
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
                  ._M_head_impl + 0x20) = lVar3;
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
                  ._M_head_impl + 0x28) = lVar4;
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
                  ._M_head_impl + 0x30) = lVar5;
  Generators<binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>>
  ::
  Generators<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>>
            ((Generators<binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>>
              *)__return_storage_ptr__,&local_38,val,moreGenerators,moreGenerators_1,
             moreGenerators_2,moreGenerators_3,moreGenerators_4,moreGenerators_5,moreGenerators_6,
             moreGenerators_7);
  if (local_38.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
      .
      super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_38.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }